

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

string * sqlcheck::GetTableName(string *__return_storage_ptr__,string *sql_statement)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rest;
  string table_template;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  long local_a0;
  char local_98 [16];
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_48;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"create table","");
  lVar1 = std::__cxx11::string::find((char *)sql_statement,(ulong)local_68[0],0);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)sql_statement);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_48,"^ +| +$|( ) +",0x10);
    local_80 = 0;
    local_78[0] = 0;
    local_88 = local_78;
    std::
    __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88,
               local_a8,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(local_a8._M_current + local_a0),&local_48,"$1",2,0);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_88);
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_48);
    uVar2 = std::__cxx11::string::find((char)&local_a8,0x20);
    uVar3 = std::__cxx11::string::find((char)&local_a8,0x28);
    cVar4 = (char)&local_a8;
    if (uVar2 < uVar3) {
      std::__cxx11::string::find(cVar4,0x20);
      std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_a8);
    }
    else {
      std::__cxx11::string::find(cVar4,0x28);
      std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_a8);
    }
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_88);
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_a8._M_current,local_a8._M_current + local_a0);
    if (local_a8._M_current != local_98) {
      operator_delete(local_a8._M_current);
    }
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTableName(const std::string& sql_statement){
  std::string table_template = "create table";
  std::size_t found = sql_statement.find(table_template);
  if (found == std::string::npos) {
    return "";
  }

  // Locate table name
  auto rest = sql_statement.substr(found + table_template.size());
  // Strip space at beginning
  rest = std::regex_replace(rest, std::regex("^ +| +$|( ) +"), "$1");
  // check if space or ( comes first in remaining string
  if (rest.find(' ') < rest.find('(')) {
    // space comes first
    rest = rest.substr(0, rest.find(' '));
  } else {
    // ( comes first
    rest = rest.substr(0, rest.find('('));
  }
  auto table_name = rest;

  return table_name;
}